

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependent_async.cpp
# Opt level: O0

int main(void)

{
  type *fuD;
  type *D;
  type *fuC;
  type *C;
  type *fuB;
  type *B;
  type *fuA;
  type *A;
  Executor executor;
  AsyncTask *in_stack_fffffffffffffd68;
  anon_class_1_0_00000001_for__M_fn *in_stack_fffffffffffffd70;
  pair<tf::AsyncTask,_std::future<void>_> *this;
  Executor *in_stack_fffffffffffffd78;
  Executor *this_00;
  anon_class_1_0_00000001_for__M_fn *in_stack_fffffffffffffd80;
  anon_class_1_0_00000001_for__M_fn *func;
  Executor *this_01;
  Executor *in_stack_fffffffffffffda0;
  pair<tf::AsyncTask,_std::future<void>_> local_208;
  type *local_1f0;
  type *local_1e8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  pointer in_stack_fffffffffffffe58;
  pointer in_stack_fffffffffffffe60;
  __atomic_base<unsigned_long> in_stack_fffffffffffffe68;
  Executor local_178;
  int local_4;
  
  local_4 = 0;
  std::thread::hardware_concurrency();
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68)
  ;
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffe68._M_i,(size_t)in_stack_fffffffffffffe60,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffe58);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x10589a);
  printf("Dependent Async\n");
  tf::Executor::
  dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_dependent_async_cpp:9:44),_nullptr>
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  this_01 = &local_178;
  std::get<0ul,tf::AsyncTask,std::future<void>>((pair<tf::AsyncTask,_std::future<void>_> *)0x1058db)
  ;
  std::get<1ul,tf::AsyncTask,std::future<void>>((pair<tf::AsyncTask,_std::future<void>_> *)0x1058ed)
  ;
  tf::Executor::
  dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_dependent_async_cpp:10:44),_tf::AsyncTask_&,_nullptr>
            (this_01,in_stack_fffffffffffffd80,(AsyncTask *)in_stack_fffffffffffffd78);
  func = (anon_class_1_0_00000001_for__M_fn *)&stack0xfffffffffffffe58;
  local_1b8 = std::get<0ul,tf::AsyncTask,std::future<void>>
                        ((pair<tf::AsyncTask,_std::future<void>_> *)0x10592e);
  local_1c0 = std::get<1ul,tf::AsyncTask,std::future<void>>
                        ((pair<tf::AsyncTask,_std::future<void>_> *)0x105940);
  tf::Executor::
  dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_dependent_async_cpp:11:44),_tf::AsyncTask_&,_nullptr>
            (this_01,func,(AsyncTask *)in_stack_fffffffffffffd78);
  this_00 = (Executor *)&stack0xfffffffffffffe28;
  local_1e8 = std::get<0ul,tf::AsyncTask,std::future<void>>
                        ((pair<tf::AsyncTask,_std::future<void>_> *)0x105981);
  local_1f0 = std::get<1ul,tf::AsyncTask,std::future<void>>
                        ((pair<tf::AsyncTask,_std::future<void>_> *)0x105993);
  tf::Executor::
  dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_dependent_async_cpp:12:44),_tf::AsyncTask_&,_tf::AsyncTask_&,_nullptr>
            (this_01,(anon_class_1_0_00000001_for__M_fn *)func,(AsyncTask *)this_00,
             (AsyncTask *)in_stack_fffffffffffffd70);
  this = &local_208;
  std::get<0ul,tf::AsyncTask,std::future<void>>((pair<tf::AsyncTask,_std::future<void>_> *)0x1059dc)
  ;
  std::get<1ul,tf::AsyncTask,std::future<void>>((pair<tf::AsyncTask,_std::future<void>_> *)0x1059ee)
  ;
  std::future<void>::get((future<void> *)func);
  printf("Silent Dependent Async\n");
  tf::Executor::
  silent_dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_dependent_async_cpp:18:39),_nullptr>
            (this_00,(anon_class_1_0_00000001 *)this);
  tf::AsyncTask::operator=(&this->first,in_stack_fffffffffffffd68);
  tf::AsyncTask::~AsyncTask((AsyncTask *)0x105a46);
  tf::Executor::
  silent_dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_dependent_async_cpp:19:39),_tf::AsyncTask_&,_nullptr>
            (this_01,(anon_class_1_0_00000001 *)func,(AsyncTask *)this_00);
  tf::AsyncTask::operator=(&this->first,in_stack_fffffffffffffd68);
  tf::AsyncTask::~AsyncTask((AsyncTask *)0x105a85);
  tf::Executor::
  silent_dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_dependent_async_cpp:20:39),_tf::AsyncTask_&,_nullptr>
            (this_01,(anon_class_1_0_00000001 *)func,(AsyncTask *)this_00);
  tf::AsyncTask::operator=(&this->first,in_stack_fffffffffffffd68);
  tf::AsyncTask::~AsyncTask((AsyncTask *)0x105ac4);
  tf::Executor::
  silent_dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_dependent_async_cpp:21:39),_tf::AsyncTask_&,_tf::AsyncTask_&,_nullptr>
            (this_01,(anon_class_1_0_00000001 *)func,(AsyncTask *)this_00,&this->first);
  tf::AsyncTask::operator=(&this->first,in_stack_fffffffffffffd68);
  tf::AsyncTask::~AsyncTask((AsyncTask *)0x105b0b);
  tf::Executor::wait_for_all(in_stack_fffffffffffffda0);
  local_4 = 0;
  std::pair<tf::AsyncTask,_std::future<void>_>::~pair(this);
  std::pair<tf::AsyncTask,_std::future<void>_>::~pair(this);
  std::pair<tf::AsyncTask,_std::future<void>_>::~pair(this);
  std::pair<tf::AsyncTask,_std::future<void>_>::~pair(this);
  tf::Executor::~Executor(in_stack_fffffffffffffda0);
  return local_4;
}

Assistant:

int main(){

  tf::Executor executor;
  
  // demonstration of dependent async (with future)
  printf("Dependent Async\n");
  auto [A, fuA] = executor.dependent_async([](){ printf("A\n"); });
  auto [B, fuB] = executor.dependent_async([](){ printf("B\n"); }, A);
  auto [C, fuC] = executor.dependent_async([](){ printf("C\n"); }, A);
  auto [D, fuD] = executor.dependent_async([](){ printf("D\n"); }, B, C);

  fuD.get();

  // demonstration of silent dependent async (without future)
  printf("Silent Dependent Async\n");
  A = executor.silent_dependent_async([](){ printf("A\n"); });
  B = executor.silent_dependent_async([](){ printf("B\n"); }, A);
  C = executor.silent_dependent_async([](){ printf("C\n"); }, A);
  D = executor.silent_dependent_async([](){ printf("D\n"); }, B, C);

  executor.wait_for_all();

  return 0;
}